

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

Result __thiscall
tonk::SessionOutgoing::sendQueuedReliable
          (SessionOutgoing *this,OutgoingQueuedDatagram *datagram,uint reliableOffset)

{
  int iVar1;
  char *source;
  uint in_ECX;
  long in_RDX;
  SessionOutgoing *in_RSI;
  ErrorResult *in_RDI;
  SessionOutgoing *unaff_retaddr;
  uint packetNumBytes;
  uint packetNum;
  int addResult;
  SiameseOriginalPacket original;
  SiameseOriginalPacket *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  ErrorType in_stack_ffffffffffffff1c;
  ErrorResult *desc;
  ErrorResult *this_00;
  undefined1 local_91 [37];
  SiameseResult local_6c;
  int local_68;
  int local_64;
  long local_60;
  long local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined8 in_stack_fffffffffffffff0;
  OutgoingQueuedDatagram *in_stack_fffffffffffffff8;
  
  if (in_ECX < *(uint *)(in_RDX + 8)) {
    local_60 = in_RDX + 0x10 + (ulong)in_ECX;
    local_64 = *(int *)(in_RDX + 8) - in_ECX;
    local_68 = 0;
    local_6c = siamese_encoder_add((SiameseEncoder)
                                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                   in_stack_ffffffffffffff10);
    iVar1 = local_68;
    if (local_6c == Siamese_Success) {
      getPacketNumBytes(in_RSI,local_68);
      in_RSI->NextSequenceNumber = iVar1 + 1U & 0x3fffff;
      sendQueuedDatagram(unaff_retaddr,in_stack_fffffffffffffff8,
                         (uint)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                         (uint)in_stack_fffffffffffffff0);
      Result::Success();
    }
    else {
      this_00 = (ErrorResult *)local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_91 + 1),"siamese_encoder_add failed",(allocator *)this_00);
      local_28 = (long)(int)local_6c;
      local_18 = local_91 + 1;
      local_1c = 1;
      desc = in_RDI;
      source = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                (this_00,source,(string *)desc,in_stack_ffffffffffffff1c,
                 (ErrorCodeT)in_stack_ffffffffffffff10);
      desc->Source = source;
      std::__cxx11::string::~string((string *)(local_91 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_91);
    }
  }
  else {
    sendQueuedDatagram(unaff_retaddr,in_stack_fffffffffffffff8,
                       (uint)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                       (uint)in_stack_fffffffffffffff0);
    Result::Success();
  }
  return (Result)in_RDI;
}

Assistant:

Result SessionOutgoing::sendQueuedReliable(
    OutgoingQueuedDatagram* datagram,
    unsigned reliableOffset)
{
    TONK_DEBUG_ASSERT(datagram->NextWriteOffset >= reliableOffset);
    if (datagram->NextWriteOffset <= reliableOffset) {
        sendQueuedDatagram(datagram, 0, 0);
        return Result::Success();
    }

    SiameseOriginalPacket original;
    original.Data = datagram->Data + reliableOffset;
    original.DataBytes = datagram->NextWriteOffset - reliableOffset;
    original.PacketNum = 0;

    // Add reliable data to the Siamese FEC encoder
    const int addResult = siamese_encoder_add(FECEncoder, &original);

    if (addResult != Siamese_Success) {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("SessionOutgoing::Flush", "siamese_encoder_add failed", ErrorType::Siamese, addResult);
    }

    const unsigned packetNum = original.PacketNum;
    const unsigned packetNumBytes = getPacketNumBytes(packetNum);

    // Update last sent packet sequence number.
    // Used for AckAck generation and sequence number compression
    TONK_DEBUG_ASSERT(NextSequenceNumber == packetNum);
    NextSequenceNumber = SIAMESE_PACKET_NUM_INC(packetNum);

    sendQueuedDatagram(datagram, packetNumBytes, packetNum);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    m_Reliable++;
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return Result::Success();
}